

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O1

void __thiscall cppcms::filters::base64_urlencode::operator()(base64_urlencode *this,ostream *out)

{
  steal_buffer<128UL> sb;
  undefined1 local_f0 [40];
  uchar *local_c8;
  streambuf *local_20;
  ostream *poStack_18;
  
  util::steal_buffer<128UL>::steal_buffer((steal_buffer<128UL> *)local_f0,out);
  (*(this->obj_).to_stream_)(out,(this->obj_).ptr_);
  if ((poStack_18 != (ostream *)0x0) && (local_20 != (streambuf *)0x0)) {
    std::ios::rdbuf((streambuf *)(poStack_18 + *(long *)(*(long *)poStack_18 + -0x18)));
  }
  local_20 = (streambuf *)0x0;
  poStack_18 = (ostream *)0x0;
  b64url::encode((uchar *)local_f0._32_8_,local_c8,out);
  util::steal_buffer<128UL>::~steal_buffer((steal_buffer<128UL> *)local_f0);
  return;
}

Assistant:

void base64_urlencode::operator()(std::ostream &out) const
	{
		util::steal_buffer<> sb(out);
		obj_(out);
		sb.release();
		using namespace cppcms::b64url;
		unsigned char const *begin=reinterpret_cast<unsigned char const *>(sb.begin());
		unsigned char const *end=  reinterpret_cast<unsigned char const *>(sb.end());
		b64url::encode(begin,end,out);
	}